

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O1

void __thiscall wasm::DataFlow::Node::addValue(Node *this,Node *value)

{
  pointer *pppNVar1;
  iterator __position;
  Node *local_10;
  Node *value_local;
  
  __position._M_current =
       (this->values).
       super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->values).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_10 = value;
    std::vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>>::
    _M_realloc_insert<wasm::DataFlow::Node*const&>
              ((vector<wasm::DataFlow::Node*,std::allocator<wasm::DataFlow::Node*>> *)&this->values,
               __position,&local_10);
  }
  else {
    *__position._M_current = value;
    pppNVar1 = &(this->values).
                super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  return;
}

Assistant:

void addValue(Node* value) { values.push_back(value); }